

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O2

MPP_RET mpp_node_set_func(MppNode node,TaskProc proc,void *param)

{
  if (node != (MppNode)0x0) {
    *(TaskProc *)((long)node + 0x28) = proc;
    *(void **)((long)node + 0x30) = param;
    return MPP_OK;
  }
  return MPP_NOK;
}

Assistant:

MPP_RET mpp_node_set_func(MppNode node, TaskProc proc, void *param)
{
    MppNodeImpl *p = (MppNodeImpl *)node;
    if (!p)
        return MPP_NOK;

    p->work.proc = proc;
    p->work.param = param;

    return MPP_OK;
}